

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture2D::Texture2D
          (Texture2D *this,RenderContext *context,deUint32 sizedFormat,int width,int height)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_24;
  int local_20;
  int height_local;
  int width_local;
  deUint32 sizedFormat_local;
  RenderContext *context_local;
  Texture2D *this_local;
  
  this->_vptr_Texture2D = (_func_int **)&PTR__Texture2D_016cf1b0;
  this->m_context = context;
  this->m_isCompressed = false;
  this->m_format = sizedFormat;
  local_24 = height;
  local_20 = width;
  height_local = sizedFormat;
  _width_local = context;
  context_local = (RenderContext *)this;
  register0x00000000 = mapGLInternalFormat(sizedFormat);
  tcu::Texture2D::Texture2D(&this->m_refTexture,(TextureFormat *)((long)&gl + 4),local_20,local_24);
  this->m_glTexture = 0;
  iVar1 = (*_width_local->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x7e);
  return;
}

Assistant:

Texture2D::Texture2D (const RenderContext& context, deUint32 sizedFormat, int width, int height)
	: m_context			(context)
	, m_isCompressed	(false)
	, m_format			(sizedFormat)
	, m_refTexture		(mapGLInternalFormat(sizedFormat), width, height)
	, m_glTexture		(0)
{
	const glw::Functions& gl = context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}